

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O0

void luaD_shrinkstack(lua_State *L)

{
  int iVar1;
  int local_18;
  int goodsize;
  int inuse;
  lua_State *L_local;
  
  iVar1 = stackinuse(L);
  local_18 = iVar1 + iVar1 / 8 + 10;
  if (1000000 < local_18) {
    local_18 = 1000000;
  }
  if (L->stacksize < 0xf4241) {
    luaE_shrinkCI(L);
  }
  else {
    luaE_freeCI(L);
  }
  if ((iVar1 < 0xf423c) && (local_18 < L->stacksize)) {
    luaD_reallocstack(L,local_18);
  }
  return;
}

Assistant:

void luaD_shrinkstack(lua_State *L) {
    int inuse = stackinuse(L);
    int goodsize = inuse + (inuse / 8) + 2 * EXTRA_STACK;
    if (goodsize > LUAI_MAXSTACK)
        goodsize = LUAI_MAXSTACK;  /* respect stack limit */
    if (L->stacksize > LUAI_MAXSTACK)  /* had been handling stack overflow? */
        luaE_freeCI(L);  /* free all CIs (list grew because of an error) */
    else
        luaE_shrinkCI(L);  /* shrink list */
    /* if thread is currently not handling a stack overflow and its
       good size is smaller than current size, shrink its stack */
    if (inuse <= (LUAI_MAXSTACK - EXTRA_STACK) &&
        goodsize < L->stacksize)
        luaD_reallocstack(L, goodsize);
    else  /* don't change stack */
        condmovestack(L, {}, {});  /* (change only for debugging) */
}